

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O0

void __thiscall
OpenMD::ForceManager::selectedPreCalculation(ForceManager *this,Molecule *mol1,Molecule *mol2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  SnapshotManager *this_00;
  Molecule *in_RDI;
  potVec zeroPot;
  Snapshot *snap;
  CutoffGroup *cg;
  CutoffGroupIterator ci;
  RigidBody *rb;
  RigidBodyIterator rbIter;
  Atom *atom;
  AtomIterator ai;
  MoleculeIterator mi;
  potVec *in_stack_fffffffffffffe58;
  Vector<double,_3U> *v;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  Vector<double,_7U> *in_stack_fffffffffffffe68;
  Snapshot *this_01;
  Snapshot *i;
  double local_178;
  Vector<double,_3U> local_170;
  undefined1 local_158 [136];
  CutoffGroup *in_stack_ffffffffffffff30;
  double local_98;
  Vector<double,_7U> local_90;
  Snapshot *local_58;
  CutoffGroup *local_50;
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  local_48;
  RigidBody *local_40;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_38;
  Atom *local_30;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_28;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_20 [4];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_20);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_28);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator(&local_38);
  __gnu_cxx::
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  ::__normal_iterator(&local_48);
  this_00 = SimInfo::getSnapshotManager
                      ((SimInfo *)
                       (in_RDI->atoms_).
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  local_58 = SnapshotManager::getCurrentSnapshot(this_00);
  Snapshot::setBondPotential(local_58,0.0);
  Snapshot::setBendPotential(local_58,0.0);
  Snapshot::setTorsionPotential(local_58,0.0);
  Snapshot::setInversionPotential(local_58,0.0);
  local_98 = 0.0;
  Vector<double,_7U>::Vector(&local_90,&local_98);
  this_01 = local_58;
  Vector<double,_7U>::Vector((Vector<double,_7U> *)local_58,in_stack_fffffffffffffe68);
  Snapshot::setLongRangePotentials
            ((Snapshot *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  i = local_58;
  Vector<double,_7U>::Vector((Vector<double,_7U> *)this_01,in_stack_fffffffffffffe68);
  Snapshot::setExcludedPotentials
            ((Snapshot *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  if (((ulong)in_RDI[1].rigidBodies_.
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_finish & 1) != 0) {
    Vector<double,_7U>::Vector((Vector<double,_7U> *)this_01,(Vector<double,_7U> *)local_58);
    Snapshot::setSelectionPotentials
              ((Snapshot *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
  }
  Snapshot::setRestraintPotential(local_58,0.0);
  Snapshot::setRawPotential(local_58,0.0);
  local_30 = Molecule::beginAtom(in_RDI,(iterator *)i);
  while (local_30 != (Atom *)0x0) {
    StuntDouble::zeroForcesAndTorques((StuntDouble *)this_01);
    local_30 = Molecule::nextAtom(in_RDI,(iterator *)i);
  }
  local_40 = Molecule::beginRigidBody(in_RDI,(iterator *)i);
  while (local_40 != (RigidBody *)0x0) {
    StuntDouble::zeroForcesAndTorques((StuntDouble *)this_01);
    local_40 = Molecule::nextRigidBody(in_RDI,(iterator *)i);
  }
  iVar1 = SimInfo::getNGlobalCutoffGroups
                    ((SimInfo *)
                     (in_RDI->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  iVar2 = SimInfo::getNGlobalAtoms
                    ((SimInfo *)
                     (in_RDI->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (iVar1 != iVar2) {
    local_50 = Molecule::beginCutoffGroup(in_RDI,(iterator *)i);
    while (local_50 != (CutoffGroup *)0x0) {
      CutoffGroup::updateCOM(in_stack_ffffffffffffff30);
      local_50 = Molecule::nextCutoffGroup(in_RDI,(iterator *)i);
    }
  }
  local_30 = Molecule::beginAtom(in_RDI,(iterator *)i);
  while (local_30 != (Atom *)0x0) {
    StuntDouble::zeroForcesAndTorques((StuntDouble *)this_01);
    local_30 = Molecule::nextAtom(in_RDI,(iterator *)i);
  }
  local_40 = Molecule::beginRigidBody(in_RDI,(iterator *)i);
  while (local_40 != (RigidBody *)0x0) {
    StuntDouble::zeroForcesAndTorques((StuntDouble *)this_01);
    local_40 = Molecule::nextRigidBody(in_RDI,(iterator *)i);
  }
  iVar2 = SimInfo::getNGlobalCutoffGroups
                    ((SimInfo *)
                     (in_RDI->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  iVar3 = SimInfo::getNGlobalAtoms
                    ((SimInfo *)
                     (in_RDI->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (iVar2 != iVar3) {
    local_50 = Molecule::beginCutoffGroup(in_RDI,(iterator *)i);
    while (local_50 != (CutoffGroup *)0x0) {
      CutoffGroup::updateCOM(in_stack_ffffffffffffff30);
      local_50 = Molecule::nextCutoffGroup(in_RDI,(iterator *)i);
    }
  }
  RectMatrix<double,_3U,_3U>::operator*=
            ((RectMatrix<double,_3U,_3U> *)CONCAT44(iVar1,iVar2),(double)in_stack_fffffffffffffe58);
  v = (Vector<double,_3U> *)
      (in_RDI->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
      super__Vector_impl_data._M_finish;
  local_178 = 0.0;
  Vector<double,_3U>::Vector(&local_170,&local_178);
  Vector3<double>::Vector3((Vector3<double> *)CONCAT44(iVar1,iVar2),v);
  (**(code **)((long)v->data_[0] + 0x170))(v,local_158);
  return;
}

Assistant:

void ForceManager::selectedPreCalculation(Molecule* mol1, Molecule* mol2) {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Atom* atom;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    // forces and potentials are zeroed here, before any are
    // accumulated.

    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    snap->setBondPotential(0.0);
    snap->setBendPotential(0.0);
    snap->setTorsionPotential(0.0);
    snap->setInversionPotential(0.0);

    potVec zeroPot(0.0);
    snap->setLongRangePotentials(zeroPot);
    snap->setExcludedPotentials(zeroPot);
    if (doPotentialSelection_) snap->setSelectionPotentials(zeroPot);

    snap->setRestraintPotential(0.0);
    snap->setRawPotential(0.0);

    // First we zero out for mol1
    for (atom = mol1->beginAtom(ai); atom != NULL; atom = mol1->nextAtom(ai)) {
      atom->zeroForcesAndTorques();
    }
    // change the positions of atoms which belong to the rigidbodies
    for (rb = mol1->beginRigidBody(rbIter); rb != NULL;
         rb = mol1->nextRigidBody(rbIter)) {
      rb->zeroForcesAndTorques();
    }
    if (info_->getNGlobalCutoffGroups() != info_->getNGlobalAtoms()) {
      for (cg = mol1->beginCutoffGroup(ci); cg != NULL;
           cg = mol1->nextCutoffGroup(ci)) {
        // calculate the center of mass of cutoff group
        cg->updateCOM();
      }
    }

    // Next we zero out for mol2
    for (atom = mol2->beginAtom(ai); atom != NULL; atom = mol2->nextAtom(ai)) {
      atom->zeroForcesAndTorques();
    }
    // change the positions of atoms which belong to the rigidbodies
    for (rb = mol2->beginRigidBody(rbIter); rb != NULL;
         rb = mol2->nextRigidBody(rbIter)) {
      rb->zeroForcesAndTorques();
    }
    if (info_->getNGlobalCutoffGroups() != info_->getNGlobalAtoms()) {
      for (cg = mol2->beginCutoffGroup(ci); cg != NULL;
           cg = mol2->nextCutoffGroup(ci)) {
        // calculate the center of mass of cutoff group
        cg->updateCOM();
      }
    }

    // Zero out the virial tensor
    virialTensor *= 0.0;
    // Zero out the heatFlux
    fDecomp_->setHeatFlux(Vector3d(0.0));
  }